

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O1

void __thiscall IR::Opnd::DumpValueType(Opnd *this)

{
  OpndKind OVar1;
  byte bVar2;
  undefined2 valueType;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  undefined4 *puVar6;
  AddrOpnd *pAVar7;
  Var aValue;
  
  bVar4 = ValueType::IsUninitialized(&this->m_valueType);
  if (bVar4) {
    return;
  }
  if (DAT_015d346a == '\0') {
    OVar1 = this->m_kind;
    if (OVar1 - 1 < 3) {
      return;
    }
    if (OVar1 == OpndKindAddr) {
      if (this[2]._vptr_Opnd != (_func_int **)0x0) {
        if (this->m_kind != OpndKindAddr) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
          if (!bVar4) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar6 = 0;
        }
        bVar2 = *(byte *)((long)&this[2].m_valueType.field_0.bits + 1);
        if ((bVar2 == 10) || (bVar2 == 1)) {
          pAVar7 = AsAddrOpnd(this);
          aValue = pAVar7->decodedValue;
          if (aValue == (Var)0x0) {
            aValue = pAVar7->m_address;
          }
          if (pAVar7->addrOpndKind == AddrOpndKindConstantVar) {
            return;
          }
          bVar4 = Js::TaggedInt::Is(aValue);
          if ((ulong)aValue >> 0x32 != 0 || bVar4) {
            return;
          }
        }
      }
    }
    else if ((((OVar1 == OpndKindReg) && (this[1]._vptr_Opnd != (_func_int **)0x0)) &&
             (uVar5 = (uint)*(byte *)((long)this[1]._vptr_Opnd + 0x1c), uVar5 < 0xb)) &&
            ((0x718U >> (uVar5 & 0x1f) & 1) != 0)) {
      return;
    }
  }
  valueType = this->m_valueType;
  DumpValueType((ValueType)valueType);
  return;
}

Assistant:

void Opnd::DumpValueType()
{
    if(m_valueType.IsUninitialized())
    {
        return;
    }

    if(!CONFIG_FLAG(Verbose))
    {
        // Skip printing the value type when it's obvious since verbose mode is off
        switch(this->GetKind())
        {
        case OpndKindIntConst:
        case OpndKindInt64Const:
        case OpndKindFloatConst:
            return;

        case OpndKindReg:
            {
                StackSym *const sym = this->AsRegOpnd()->m_sym;
                if(sym && (
                    sym->IsInt32() ||
                    sym->IsFloat32() ||
                    sym->IsFloat64() ||
                    sym->IsInt64() ||
                    sym->IsUint64()
                    ))
                {
                    return;
                }
                break;
            }

        case OpndKindAddr:
            if(this->AsAddrOpnd()->m_address && this->AsAddrOpnd()->IsVar())
            {
                IR::AddrOpnd *addrOpnd = this->AsAddrOpnd();
                Js::Var address = addrOpnd->decodedValue ? addrOpnd->decodedValue : addrOpnd->m_address;

                // Tagged int might be encoded here, so check the type
                if (addrOpnd->GetAddrOpndKind() == AddrOpndKindConstantVar
                    || Js::TaggedInt::Is(address) || (
#if !FLOATVAR
                    !JITManager::GetJITManager()->IsOOPJITEnabled() &&
#endif
                    Js::JavascriptNumber::Is_NoTaggedIntCheck(address)))
                {
                    return;
                }
            }
            break;
        }
    }

    DumpValueType(m_valueType);
}